

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O3

int mbedtls_gcm_starts(mbedtls_gcm_context *ctx,int mode,uchar *iv,size_t iv_len,uchar *add,
                      size_t add_len)

{
  uchar *x;
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  size_t olen;
  size_t local_50;
  ulong local_48;
  ulong uStack_40;
  
  local_50 = 0;
  iVar2 = -0x14;
  if ((add_len | iv_len) >> 0x3d == 0) {
    x = ctx->y;
    ctx->buf[0] = '\0';
    ctx->buf[1] = '\0';
    ctx->buf[2] = '\0';
    ctx->buf[3] = '\0';
    ctx->buf[4] = '\0';
    ctx->buf[5] = '\0';
    ctx->buf[6] = '\0';
    ctx->buf[7] = '\0';
    ctx->buf[8] = '\0';
    ctx->buf[9] = '\0';
    ctx->buf[10] = '\0';
    ctx->buf[0xb] = '\0';
    ctx->buf[0xc] = '\0';
    ctx->buf[0xd] = '\0';
    ctx->buf[0xe] = '\0';
    ctx->buf[0xf] = '\0';
    ctx->y[0] = '\0';
    ctx->y[1] = '\0';
    ctx->y[2] = '\0';
    ctx->y[3] = '\0';
    ctx->y[4] = '\0';
    ctx->y[5] = '\0';
    ctx->y[6] = '\0';
    ctx->y[7] = '\0';
    ctx->y[8] = '\0';
    ctx->y[9] = '\0';
    ctx->y[10] = '\0';
    ctx->y[0xb] = '\0';
    ctx->y[0xc] = '\0';
    ctx->y[0xd] = '\0';
    ctx->y[0xe] = '\0';
    ctx->y[0xf] = '\0';
    ctx->mode = mode;
    ctx->len = 0;
    ctx->add_len = 0;
    if (iv_len == 0xc) {
      *(undefined4 *)(ctx->y + 8) = *(undefined4 *)(iv + 8);
      *(undefined8 *)x = *(undefined8 *)iv;
      ctx->y[0xf] = '\x01';
    }
    else {
      uVar1 = (ushort)(iv_len >> 5);
      uStack_40 = (ulong)(uVar1 & 0xff00 | (ushort)(iv_len >> 0x15) & 0xff) << 0x20 |
                  (ulong)(ushort)((ushort)(((int)iv_len * 8 & 0xffU) << 8) | uVar1 & 0xff) << 0x30;
      local_48 = 0;
      if (iv_len != 0) {
        do {
          uVar4 = 0x10;
          if (iv_len < 0x10) {
            uVar4 = iv_len;
          }
          uVar3 = 0;
          do {
            ctx->y[uVar3] = ctx->y[uVar3] ^ iv[uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar4 != uVar3);
          gcm_mult(ctx,x,x);
          iv = iv + uVar4;
          iv_len = iv_len - uVar4;
        } while (iv_len != 0);
      }
      uVar4 = *(ulong *)(ctx->y + 8);
      *(ulong *)ctx->y = *(ulong *)ctx->y ^ local_48;
      *(ulong *)(ctx->y + 8) = uVar4 ^ uStack_40;
      gcm_mult(ctx,x,x);
    }
    iVar2 = mbedtls_cipher_update(&ctx->cipher_ctx,x,0x10,ctx->base_ectr,&local_50);
    if (iVar2 == 0) {
      ctx->add_len = add_len;
      if (add_len != 0) {
        do {
          uVar4 = 0x10;
          if (add_len < 0x10) {
            uVar4 = add_len;
          }
          uVar3 = 0;
          do {
            ctx->buf[uVar3] = ctx->buf[uVar3] ^ add[uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar4 != uVar3);
          gcm_mult(ctx,ctx->buf,ctx->buf);
          add = add + uVar4;
          add_len = add_len - uVar4;
        } while (add_len != 0);
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_gcm_starts( mbedtls_gcm_context *ctx,
                int mode,
                const unsigned char *iv,
                size_t iv_len,
                const unsigned char *add,
                size_t add_len )
{
    int ret;
    unsigned char work_buf[16];
    size_t i;
    const unsigned char *p;
    size_t use_len, olen = 0;

    /* IV and AD are limited to 2^64 bits, so 2^61 bytes */
    if( ( (uint64_t) iv_len  ) >> 61 != 0 ||
        ( (uint64_t) add_len ) >> 61 != 0 )
    {
        return( MBEDTLS_ERR_GCM_BAD_INPUT );
    }

    memset( ctx->y, 0x00, sizeof(ctx->y) );
    memset( ctx->buf, 0x00, sizeof(ctx->buf) );

    ctx->mode = mode;
    ctx->len = 0;
    ctx->add_len = 0;

    if( iv_len == 12 )
    {
        memcpy( ctx->y, iv, iv_len );
        ctx->y[15] = 1;
    }
    else
    {
        memset( work_buf, 0x00, 16 );
        PUT_UINT32_BE( iv_len * 8, work_buf, 12 );

        p = iv;
        while( iv_len > 0 )
        {
            use_len = ( iv_len < 16 ) ? iv_len : 16;

            for( i = 0; i < use_len; i++ )
                ctx->y[i] ^= p[i];

            gcm_mult( ctx, ctx->y, ctx->y );

            iv_len -= use_len;
            p += use_len;
        }

        for( i = 0; i < 16; i++ )
            ctx->y[i] ^= work_buf[i];

        gcm_mult( ctx, ctx->y, ctx->y );
    }

    if( ( ret = mbedtls_cipher_update( &ctx->cipher_ctx, ctx->y, 16, ctx->base_ectr,
                             &olen ) ) != 0 )
    {
        return( ret );
    }

    ctx->add_len = add_len;
    p = add;
    while( add_len > 0 )
    {
        use_len = ( add_len < 16 ) ? add_len : 16;

        for( i = 0; i < use_len; i++ )
            ctx->buf[i] ^= p[i];

        gcm_mult( ctx, ctx->buf, ctx->buf );

        add_len -= use_len;
        p += use_len;
    }

    return( 0 );
}